

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

char * cli_concat_args(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *result;
  size_t length;
  int i;
  char **argv_local;
  int argc_local;
  
  result = (char *)0x1;
  for (length._4_4_ = 1; length._4_4_ < argc; length._4_4_ = length._4_4_ + 1) {
    sVar2 = strlen(argv[length._4_4_]);
    result = result + sVar2 + 1;
  }
  pcVar3 = (char *)xmalloc((size_t)result);
  result = (char *)0x0;
  for (length._4_4_ = 1; length._4_4_ < argc; length._4_4_ = length._4_4_ + 1) {
    iVar1 = sprintf(pcVar3 + (long)result,"%s ",argv[length._4_4_]);
    result = result + iVar1;
  }
  (pcVar3 + -1)[(long)result] = '\0';
  return pcVar3;
}

Assistant:

char *cli_concat_args(int argc, const char *argv[])
{
	int i;
	size_t length = 1;
	for (i = 1; i < argc; i++) {
		length += strlen(argv[i]) + 1;
	}
	char *result = (char *)xmalloc(length);

	length = 0;
	for (i = 1; i < argc; i++) {
		length += sprintf(result + length, "%s ", argv[i]);
	}
	result[--length] = '\0';
	return result;
}